

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void quit_hook(char *s)

{
  uint uVar1;
  
  for (uVar1 = 7; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    if (angband_term[uVar1] != (term *)0x0) {
      term_nuke(angband_term[uVar1]);
    }
  }
  return;
}

Assistant:

static void quit_hook(const char *s)
{
	int j;

	/* Unused parameter */
	(void)s;

	/* Scan windows */
	for (j = ANGBAND_TERM_MAX - 1; j >= 0; j--) {
		/* Unused */
		if (!angband_term[j]) continue;

		/* Nuke it */
		term_nuke(angband_term[j]);
	}
}